

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNextWindowCollapsed(bool collapsed,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  ImGuiCond local_20;
  bool local_19;
  ImGuiContext *g;
  ImGuiCond cond_local;
  bool collapsed_local;
  
  pIVar1 = GImGui;
  local_19 = true;
  if (cond != 0) {
    local_19 = ImIsPowerOfTwo(cond);
  }
  if (local_19 != false) {
    (pIVar1->NextWindowData).Flags = (pIVar1->NextWindowData).Flags | 8;
    (pIVar1->NextWindowData).CollapsedVal = collapsed;
    local_20 = cond;
    if (cond == 0) {
      local_20 = 1;
    }
    (pIVar1->NextWindowData).CollapsedCond = local_20;
    return;
  }
  __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x1c79,"void ImGui::SetNextWindowCollapsed(bool, ImGuiCond)");
}

Assistant:

void ImGui::SetNextWindowCollapsed(bool collapsed, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasCollapsed;
    g.NextWindowData.CollapsedVal = collapsed;
    g.NextWindowData.CollapsedCond = cond ? cond : ImGuiCond_Always;
}